

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O3

QString * buddyString(QString *__return_storage_ptr__,QWidget *widget)

{
  long lVar1;
  QString *in_RAX;
  QLabel *this;
  QWidget *pQVar2;
  QGroupBox *this_00;
  QString *pQVar3;
  long lVar4;
  
  if ((widget == (QWidget *)0x0) ||
     (in_RAX = *(QString **)(*(long *)&widget->field_0x8 + 0x10), in_RAX == (QString *)0x0)) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    lVar1 = *(long *)((in_RAX->d).ptr + 0x14);
    if (lVar1 != 0) {
      lVar4 = 0;
      do {
        this = (QLabel *)QMetaObject::cast((QObject *)&QLabel::staticMetaObject);
        if (this != (QLabel *)0x0) {
          pQVar2 = QLabel::buddy(this);
          if (pQVar2 == widget) {
            pQVar3 = QLabel::text(__return_storage_ptr__,this);
            return pQVar3;
          }
        }
        lVar4 = lVar4 + 8;
      } while (lVar1 << 3 != lVar4);
    }
    this_00 = (QGroupBox *)QMetaObject::cast((QObject *)&QGroupBox::staticMetaObject);
    if (this_00 != (QGroupBox *)0x0) {
      pQVar3 = QGroupBox::title(__return_storage_ptr__,this_00);
      return pQVar3;
    }
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    in_RAX = __return_storage_ptr__;
  }
  return in_RAX;
}

Assistant:

static QString buddyString(const QWidget *widget)
{
    if (!widget)
        return QString();
    QWidget *parent = widget->parentWidget();
    if (!parent)
        return QString();
#if QT_CONFIG(shortcut) && QT_CONFIG(label)
    for (QObject *o : parent->children()) {
        QLabel *label = qobject_cast<QLabel*>(o);
        if (label && label->buddy() == widget)
            return label->text();
    }
#endif

#if QT_CONFIG(groupbox)
    QGroupBox *groupbox = qobject_cast<QGroupBox*>(parent);
    if (groupbox)
        return groupbox->title();
#endif

    return QString();
}